

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O0

void objc_init_load_messages_table(void)

{
  load_messages_initialize(&load_table,0x1000);
  loadSel = sel_registerName("load");
  return;
}

Assistant:

PRIVATE void objc_init_load_messages_table(void)
{
	load_messages_initialize(&load_table, 4096);
	loadSel = sel_registerName("load");
}